

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O0

void google::protobuf::internal::MapFieldPrinterHelper::CopyValue
               (MapValueRef *value,Message *message,FieldDescriptor *field_desc)

{
  Reflection *field;
  FieldDescriptor *message_00;
  bool value_00;
  CppType CVar1;
  int value_01;
  int32_t value_02;
  uint32_t value_03;
  Message *pMVar2;
  Message *from;
  int64_t value_04;
  uint64_t value_05;
  float value_06;
  double value_07;
  allocator<char> local_61;
  string_view local_60;
  string local_50;
  Message *local_30;
  Message *sub_message;
  Reflection *reflection;
  FieldDescriptor *field_desc_local;
  Message *message_local;
  MapValueRef *value_local;
  
  reflection = (Reflection *)field_desc;
  field_desc_local = (FieldDescriptor *)message;
  message_local = (Message *)value;
  sub_message = (Message *)Message::GetReflection(message);
  CVar1 = FieldDescriptor::cpp_type((FieldDescriptor *)reflection);
  message_00 = field_desc_local;
  field = reflection;
  pMVar2 = sub_message;
  switch(CVar1) {
  case CPPTYPE_INT32:
    value_02 = MapValueConstRef::GetInt32Value((MapValueConstRef *)message_local);
    Reflection::SetInt32
              ((Reflection *)pMVar2,(Message *)message_00,(FieldDescriptor *)field,value_02);
    break;
  case CPPTYPE_INT64:
    value_04 = MapValueConstRef::GetInt64Value((MapValueConstRef *)message_local);
    Reflection::SetInt64
              ((Reflection *)pMVar2,(Message *)message_00,(FieldDescriptor *)field,value_04);
    break;
  case CPPTYPE_UINT32:
    value_03 = MapValueConstRef::GetUInt32Value((MapValueConstRef *)message_local);
    Reflection::SetUInt32
              ((Reflection *)pMVar2,(Message *)message_00,(FieldDescriptor *)field,value_03);
    break;
  case CPPTYPE_UINT64:
    value_05 = MapValueConstRef::GetUInt64Value((MapValueConstRef *)message_local);
    Reflection::SetUInt64
              ((Reflection *)pMVar2,(Message *)message_00,(FieldDescriptor *)field,value_05);
    break;
  case CPPTYPE_DOUBLE:
    value_07 = MapValueConstRef::GetDoubleValue((MapValueConstRef *)message_local);
    Reflection::SetDouble
              ((Reflection *)pMVar2,(Message *)message_00,(FieldDescriptor *)field,value_07);
    break;
  case CPPTYPE_FLOAT:
    value_06 = MapValueConstRef::GetFloatValue((MapValueConstRef *)message_local);
    Reflection::SetFloat
              ((Reflection *)pMVar2,(Message *)message_00,(FieldDescriptor *)field,value_06);
    break;
  case CPPTYPE_BOOL:
    value_00 = MapValueConstRef::GetBoolValue((MapValueConstRef *)message_local);
    Reflection::SetBool((Reflection *)pMVar2,(Message *)message_00,(FieldDescriptor *)field,value_00
                       );
    break;
  case CPPTYPE_ENUM:
    value_01 = MapValueConstRef::GetEnumValue((MapValueConstRef *)message_local);
    Reflection::SetEnumValue
              ((Reflection *)pMVar2,(Message *)message_00,(FieldDescriptor *)field,value_01);
    break;
  case CPPTYPE_STRING:
    local_60 = MapValueConstRef::GetStringValue((MapValueConstRef *)message_local);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
              ((string *)&local_50,&local_60,&local_61);
    Reflection::SetString
              ((Reflection *)pMVar2,(Message *)message_00,(FieldDescriptor *)field,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::allocator<char>::~allocator(&local_61);
    break;
  case CPPTYPE_MESSAGE:
    pMVar2 = MapValueConstRef::GetMessageValue((MapValueConstRef *)message_local);
    pMVar2 = Message::New(pMVar2);
    local_30 = pMVar2;
    from = MapValueConstRef::GetMessageValue((MapValueConstRef *)message_local);
    Message::CopyFrom(pMVar2,from);
    Reflection::SetAllocatedMessage
              ((Reflection *)sub_message,(Message *)field_desc_local,local_30,
               (FieldDescriptor *)reflection);
  }
  return;
}

Assistant:

void MapFieldPrinterHelper::CopyValue(const MapValueRef& value,
                                      Message* message,
                                      const FieldDescriptor* field_desc) {
  const Reflection* reflection = message->GetReflection();
  switch (field_desc->cpp_type()) {
    case FieldDescriptor::CPPTYPE_DOUBLE:
      reflection->SetDouble(message, field_desc, value.GetDoubleValue());
      return;
    case FieldDescriptor::CPPTYPE_FLOAT:
      reflection->SetFloat(message, field_desc, value.GetFloatValue());
      return;
    case FieldDescriptor::CPPTYPE_ENUM:
      reflection->SetEnumValue(message, field_desc, value.GetEnumValue());
      return;
    case FieldDescriptor::CPPTYPE_MESSAGE: {
      Message* sub_message = value.GetMessageValue().New();
      sub_message->CopyFrom(value.GetMessageValue());
      reflection->SetAllocatedMessage(message, sub_message, field_desc);
      return;
    }
    case FieldDescriptor::CPPTYPE_STRING:
      reflection->SetString(message, field_desc,
                            std::string(value.GetStringValue()));
      return;
    case FieldDescriptor::CPPTYPE_INT64:
      reflection->SetInt64(message, field_desc, value.GetInt64Value());
      return;
    case FieldDescriptor::CPPTYPE_INT32:
      reflection->SetInt32(message, field_desc, value.GetInt32Value());
      return;
    case FieldDescriptor::CPPTYPE_UINT64:
      reflection->SetUInt64(message, field_desc, value.GetUInt64Value());
      return;
    case FieldDescriptor::CPPTYPE_UINT32:
      reflection->SetUInt32(message, field_desc, value.GetUInt32Value());
      return;
    case FieldDescriptor::CPPTYPE_BOOL:
      reflection->SetBool(message, field_desc, value.GetBoolValue());
      return;
  }
}